

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Lib::Array<bool>::expandToFit(Array<bool> *this,size_t n)

{
  void *placement;
  bool *pbVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  int i;
  bool *newArray;
  void *mem;
  size_t newCapacity;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  size_t local_18;
  
  local_18 = in_RDI[1] << 1;
  if (local_18 <= in_RSI) {
    local_18 = in_RSI + 1;
  }
  placement = Lib::alloc(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pbVar1 = array_new<bool>(placement,local_18);
  if (in_RDI[1] != 0) {
    iVar2 = (int)in_RDI[1];
    while (iVar2 = iVar2 + -1, -1 < iVar2) {
      pbVar1[iVar2] = (bool)(*(byte *)(in_RDI[2] + (long)iVar2) & 1);
    }
  }
  if (in_RDI[2] != 0) {
    array_delete<bool>((bool *)in_RDI[2],in_RDI[1]);
    Lib::free((void *)in_RDI[2]);
  }
  in_RDI[2] = pbVar1;
  (**(code **)*in_RDI)(in_RDI,in_RDI[1],local_18);
  in_RDI[1] = local_18;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }